

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Accuracy::Texture2DFilteringCase::init(Texture2DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *this_00;
  bool bVar1;
  reference ppTVar2;
  Texture2D *this_01;
  TextureFormatInfo *pTVar3;
  ulong uVar4;
  TextureFormatInfo *extraout_RAX;
  TextureFormatInfo *extraout_RAX_00;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  pointer ppTVar12;
  deUint32 step;
  Vec4 gMax;
  Vec4 gMin;
  Vector<float,_4> res_3;
  TextureFormatInfo fmtInfo;
  RGBA local_110;
  RGBA local_10c;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  Vec4 local_e8;
  Vec4 local_d8;
  ulong local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  Vec4 local_88;
  TextureFormatInfo local_78;
  
  this_00 = &this->m_textures;
  if ((this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,2);
    bVar1 = true;
    do {
      bVar6 = bVar1;
      this_01 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (this_01,this->m_renderCtx,this->m_internalFormat,this->m_width,this->m_height);
      local_78.valueMin.m_data._0_8_ = this_01;
      std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
                ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
                 (Texture2D **)&local_78);
      bVar1 = false;
    } while (bVar6);
    uVar9 = this->m_height;
    if (this->m_height < this->m_width) {
      uVar9 = this->m_width;
    }
    uVar7 = 0x20;
    if (uVar9 != 0) {
      uVar7 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = uVar7 ^ 0x1f;
    }
    pTVar3 = tcu::getTextureFormatInfo
                       (&local_78,
                        (TextureFormat *)
                        &(*(this_00->
                           super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                           _M_impl.super__Vector_impl_data._M_start)->m_refTexture);
    if (uVar9 != 0) {
      uVar5 = 0x1f - uVar7;
      local_c0 = (ulong)uVar5;
      lVar10 = 0;
      uVar4 = 0;
      if (0 < (int)uVar5) {
        uVar4 = (ulong)uVar5;
      }
      local_b8 = local_78.valueMax.m_data[0] - local_78.valueMin.m_data[0];
      fStack_b4 = local_78.valueMax.m_data[1] - local_78.valueMin.m_data[1];
      fStack_b0 = local_78.valueMax.m_data[2] - local_78.valueMin.m_data[2];
      fStack_ac = local_78.valueMax.m_data[3] - local_78.valueMin.m_data[3];
      local_f8 = local_b8 * -0.5 + local_78.valueMin.m_data[0];
      fStack_f4 = fStack_b4 * -0.5 + local_78.valueMin.m_data[1];
      fStack_f0 = fStack_b0 * -0.5 + local_78.valueMin.m_data[2];
      fStack_ec = fStack_ac * 2.0 + local_78.valueMin.m_data[3];
      local_a8 = local_78.valueMin.m_data[0];
      fStack_a4 = local_78.valueMin.m_data[1];
      fStack_a0 = local_78.valueMin.m_data[2];
      fStack_9c = local_78.valueMin.m_data[3];
      fStack_100 = fStack_b0 * 1.0 + local_78.valueMin.m_data[2];
      fStack_fc = fStack_ac * 0.0 + local_78.valueMin.m_data[3];
      local_108 = CONCAT44(fStack_b4 * 1.0 + local_78.valueMin.m_data[1],
                           local_b8 * 1.0 + local_78.valueMin.m_data[0]);
      iVar8 = 0;
      do {
        local_d8.m_data[1] = fStack_f4;
        local_d8.m_data[0] = local_f8;
        local_d8.m_data[3] = fStack_ec;
        local_d8.m_data[2] = fStack_f0;
        local_e8.m_data[3] = fStack_fc;
        local_e8.m_data[2] = fStack_100;
        local_e8.m_data[0] = (float)(undefined4)local_108;
        local_e8.m_data[1] = (float)local_108._4_4_;
        tcu::Texture2D::allocLevel
                  (&(*(this_00->
                      super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                      _M_impl.super__Vector_impl_data._M_start)->m_refTexture,iVar8);
        tcu::fillWithComponentGradients
                  ((PixelBufferAccess *)
                   (*(long *)&((*(this_00->
                                 super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->m_refTexture).
                              super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl + lVar10),&local_d8,&local_e8);
        iVar8 = iVar8 + 1;
        lVar10 = lVar10 + 0x28;
      } while (uVar4 * 0x28 + 0x28 != lVar10);
      pTVar3 = extraout_RAX;
      if (uVar9 != 0) {
        uVar11 = 0;
        local_f8 = (float)(0xffffff / (ulong)(0x20 - uVar7));
        uVar4 = local_c0 & 0xffffffff;
        if ((int)local_c0 < 1) {
          uVar4 = uVar11;
        }
        local_108 = uVar4 * 0x28 + 0x28;
        iVar8 = 0;
        do {
          tcu::Texture2D::allocLevel
                    (&(this_00->
                      super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                      _M_impl.super__Vector_impl_data._M_start[1]->m_refTexture,iVar8);
          uVar9 = (int)local_f8 * iVar8;
          local_10c.m_value = uVar9 | 0xff000000;
          lVar10 = *(long *)&((this_00->
                              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[1]->m_refTexture).
                             super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl;
          tcu::RGBA::toVec(&local_10c);
          local_110.m_value = ~uVar9 | 0xff000000;
          local_d8.m_data[1] = local_e8.m_data[1] * fStack_b4 + fStack_a4;
          local_d8.m_data[0] = local_e8.m_data[0] * local_b8 + local_a8;
          local_d8.m_data[3] = local_e8.m_data[3] * fStack_ac + fStack_9c;
          local_d8.m_data[2] = local_e8.m_data[2] * fStack_b0 + fStack_a0;
          tcu::RGBA::toVec(&local_110);
          local_88.m_data[0] = local_98 * local_b8 + local_a8;
          local_88.m_data[1] = fStack_94 * fStack_b4 + fStack_a4;
          local_88.m_data[2] = fStack_90 * fStack_b0 + fStack_a0;
          local_88.m_data[3] = fStack_8c * fStack_ac + fStack_9c;
          tcu::fillWithGrid((PixelBufferAccess *)(lVar10 + uVar11),4,&local_d8,&local_88);
          iVar8 = iVar8 + 1;
          uVar11 = uVar11 + 0x28;
          pTVar3 = extraout_RAX_00;
        } while (local_108 != uVar11);
      }
    }
    for (ppTVar12 = (this->m_textures).
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                    super__Vector_impl_data._M_start; iVar8 = (int)pTVar3,
        ppTVar12 !=
        (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppTVar12 = ppTVar12 + 1) {
      uVar9 = (*(*ppTVar12)->_vptr_Texture2D[2])();
      pTVar3 = (TextureFormatInfo *)(ulong)uVar9;
    }
  }
  else {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,1);
    local_78.valueMin.m_data._0_8_ =
         glu::Texture2D::create
                   (this->m_renderCtx,this->m_renderCtxInfo,
                    ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive,
                    (int)((ulong)((long)(this->m_filenames).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_filenames).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5),
                    &this->m_filenames);
    ppTVar2 = std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
              emplace_back<glu::Texture2D*>
                        ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
                         (Texture2D **)&local_78);
    iVar8 = (int)ppTVar2;
  }
  return iVar8;
}

Assistant:

void Texture2DFilteringCase::init (void)
{
	try
	{
		if (!m_filenames.empty())
		{
			m_textures.reserve(1);
			m_textures.push_back(glu::Texture2D::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size(), m_filenames));
		}
		else
		{
			// Create 2 textures.
			m_textures.reserve(2);
			for (int ndx = 0; ndx < 2; ndx++)
				m_textures.push_back(new glu::Texture2D(m_renderCtx, m_internalFormat, m_width, m_height));

			const int				numLevels	= deLog2Floor32(de::max(m_width, m_height))+1;
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
			tcu::Vec4				cBias		= fmtInfo.valueMin;
			tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill first gradient texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				tcu::Vec4 gMin = tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
				tcu::Vec4 gMax = tcu::Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

				m_textures[0]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
			}

			// Fill second with grid texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / numLevels;
				deUint32	rgb		= step*levelNdx;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}

			// Upload.
			for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
				(*i)->upload();
		}
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DFilteringCase::deinit();
		throw;
	}
}